

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  __m128i *palVar9;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong size;
  ulong uVar24;
  __m128i *ptr_02;
  undefined4 uVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  longlong lVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i_64_t B_1;
  undefined1 auVar43 [16];
  long lVar45;
  undefined1 auVar44 [16];
  __m128i_64_t B;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i_64_t B_4;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar79;
  int iVar80;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar87;
  undefined1 auVar82 [16];
  int iVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar93;
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int64_t iVar49;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse2_128_64_cold_4();
        }
        else {
          uVar21 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse2_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse2_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse2_128_64_cold_1();
          }
          else {
            uVar7 = uVar2 - 1;
            size = (ulong)uVar2 + 1 >> 1;
            uVar11 = (ulong)(uint)open;
            iVar15 = -open;
            iVar61 = ppVar4->min;
            uVar12 = uVar11 | 0x8000000000000000;
            uVar24 = 0x8000000000000000 - (long)iVar61;
            if (iVar61 != iVar15 && SBORROW4(iVar61,iVar15) == iVar61 + open < 0) {
              uVar24 = uVar12;
            }
            iVar61 = ppVar4->max;
            ppVar8 = parasail_result_new_table1((uint)((ulong)uVar2 + 1) & 0x7ffffffe,s2Len);
            uVar27 = (undefined4)uVar12;
            if (ppVar8 != (parasail_result_t *)0x0) {
              iVar36 = (int)(uVar7 / size);
              ppVar8->flag = ppVar8->flag | 0x2820801;
              palVar9 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              auVar41._0_4_ = -(uint)((int)((ulong)palVar9 >> 0x20) == 0 && (int)palVar9 == 0);
              auVar41._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar41._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar41._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar10 = movmskps(uVar27,auVar41);
              if (iVar10 == 0) {
                iVar10 = s2Len + -1;
                uVar29 = (ulong)(uint)gap;
                lVar13 = uVar24 + 1;
                lVar19 = 0x7ffffffffffffffe - (long)iVar61;
                auVar33._8_4_ = (int)lVar13;
                auVar33._0_8_ = lVar13;
                auVar33._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar27 = (undefined4)((ulong)lVar19 >> 0x20);
                auVar37._8_4_ = (int)lVar19;
                auVar37._0_8_ = lVar19;
                auVar37._12_4_ = uVar27;
                uVar12 = (ulong)(uint)gap;
                lVar17 = (long)iVar15;
                lVar14 = size << 4;
                lVar22 = 0;
                lVar13 = lVar17;
                do {
                  plVar1 = (long *)((long)*palVar9 + lVar22);
                  *plVar1 = lVar13;
                  plVar1[1] = -(size * uVar12) + lVar13;
                  plVar1 = (long *)((long)*ptr_00 + lVar22);
                  *plVar1 = lVar13 - uVar11;
                  plVar1[1] = (-(size * uVar12) - uVar11) + lVar13;
                  lVar13 = lVar13 - uVar12;
                  lVar22 = lVar22 + 0x10;
                } while (lVar14 != lVar22);
                *ptr_01 = 0;
                auVar43 = _DAT_00903aa0;
                auVar41 = _DAT_00903a90;
                lVar13 = uVar21 - 1;
                auVar40._8_4_ = (int)lVar13;
                auVar40._0_8_ = lVar13;
                auVar40._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar20 = 0;
                auVar40 = auVar40 ^ _DAT_00903aa0;
                do {
                  auVar50._8_4_ = (int)uVar20;
                  auVar50._0_8_ = uVar20;
                  auVar50._12_4_ = (int)(uVar20 >> 0x20);
                  auVar50 = (auVar50 | auVar41) ^ auVar43;
                  if ((bool)(~(auVar50._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar50._0_4_ ||
                              auVar40._4_4_ < auVar50._4_4_) & 1)) {
                    ptr_01[uVar20 + 1] = lVar17;
                  }
                  if ((auVar50._12_4_ != auVar40._12_4_ || auVar50._8_4_ <= auVar40._8_4_) &&
                      auVar50._12_4_ <= auVar40._12_4_) {
                    ptr_01[uVar20 + 2] = lVar17 - uVar12;
                  }
                  auVar50 = _DAT_00904920;
                  uVar20 = uVar20 + 2;
                  lVar17 = lVar17 + uVar12 * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar20);
                lVar17 = size * uVar21 * 4;
                lVar13 = 0;
                uVar12 = 0;
                auVar41 = auVar33;
                do {
                  ptr_02 = ptr;
                  ptr = palVar9;
                  iVar61 = ppVar4->mapper[(byte)s2[uVar12]];
                  iVar49 = ptr_01[uVar12];
                  lVar28 = ptr[(int)size - 1][0];
                  lVar18 = 0;
                  lVar22 = lVar13;
                  auVar43 = auVar33;
                  do {
                    plVar1 = (long *)((long)pvVar3 + lVar18 + (long)iVar61 * (long)(int)size * 0x10)
                    ;
                    auVar51._0_8_ = iVar49 + *plVar1;
                    auVar51._8_8_ = lVar28 + plVar1[1];
                    auVar40 = *(undefined1 (*) [16])((long)*ptr_00 + lVar18);
                    auVar62 = auVar51 ^ auVar50;
                    auVar57 = auVar40 ^ auVar50;
                    iVar15 = -(uint)(auVar57._0_4_ < auVar62._0_4_);
                    iVar79 = auVar57._4_4_;
                    auVar71._4_4_ = -(uint)(iVar79 < auVar62._4_4_);
                    iVar80 = -(uint)(auVar57._8_4_ < auVar62._8_4_);
                    iVar81 = auVar57._12_4_;
                    auVar71._12_4_ = -(uint)(iVar81 < auVar62._12_4_);
                    auVar82._4_4_ = iVar15;
                    auVar82._0_4_ = iVar15;
                    auVar82._8_4_ = iVar80;
                    auVar82._12_4_ = iVar80;
                    auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar79);
                    auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar81);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar71 = auVar71 | auVar63 & auVar82;
                    auVar72 = ~auVar71 & auVar40 | auVar51 & auVar71;
                    auVar62 = auVar72 ^ auVar50;
                    auVar64 = auVar43 ^ auVar50;
                    iVar15 = -(uint)(auVar64._0_4_ < auVar62._0_4_);
                    iVar69 = auVar64._4_4_;
                    iVar87 = -(uint)(iVar69 < auVar62._4_4_);
                    iVar80 = -(uint)(auVar64._8_4_ < auVar62._8_4_);
                    iVar70 = auVar64._12_4_;
                    iVar88 = -(uint)(iVar70 < auVar62._12_4_);
                    auVar89._4_4_ = iVar15;
                    auVar89._0_4_ = iVar15;
                    auVar89._8_4_ = iVar80;
                    auVar89._12_4_ = iVar80;
                    iVar15 = -(uint)(auVar62._4_4_ == iVar69);
                    iVar80 = -(uint)(auVar62._12_4_ == iVar70);
                    auVar94._4_4_ = iVar15;
                    auVar94._0_4_ = iVar15;
                    auVar94._8_4_ = iVar80;
                    auVar94._12_4_ = iVar80;
                    auVar52._4_4_ = iVar87;
                    auVar52._0_4_ = iVar87;
                    auVar52._8_4_ = iVar88;
                    auVar52._12_4_ = iVar88;
                    auVar52 = auVar52 | auVar94 & auVar89;
                    auVar53 = ~auVar52 & auVar43 | auVar72 & auVar52;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar18) = auVar53;
                    auVar62 = auVar41 ^ auVar50;
                    auVar83 = auVar53 ^ auVar50;
                    iVar87 = -(uint)(auVar83._0_4_ < auVar62._0_4_);
                    iVar15 = auVar83._4_4_;
                    auVar90._4_4_ = -(uint)(iVar15 < auVar62._4_4_);
                    iVar88 = -(uint)(auVar83._8_4_ < auVar62._8_4_);
                    iVar80 = auVar83._12_4_;
                    auVar90._12_4_ = -(uint)(iVar80 < auVar62._12_4_);
                    auVar95._4_4_ = iVar87;
                    auVar95._0_4_ = iVar87;
                    auVar95._8_4_ = iVar88;
                    auVar95._12_4_ = iVar88;
                    auVar72._4_4_ = -(uint)(auVar62._4_4_ == iVar15);
                    auVar72._12_4_ = -(uint)(auVar62._12_4_ == iVar80);
                    auVar72._0_4_ = auVar72._4_4_;
                    auVar72._8_4_ = auVar72._12_4_;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar90 = auVar90 | auVar72 & auVar95;
                    auVar41 = ~auVar90 & auVar53 | auVar41 & auVar90;
                    auVar62 = auVar37 ^ auVar50;
                    iVar87 = -(uint)(auVar62._0_4_ < auVar83._0_4_);
                    iVar88 = -(uint)(auVar62._4_4_ < iVar15);
                    iVar92 = -(uint)(auVar62._8_4_ < auVar83._8_4_);
                    iVar93 = -(uint)(auVar62._12_4_ < iVar80);
                    auVar96._4_4_ = iVar87;
                    auVar96._0_4_ = iVar87;
                    auVar96._8_4_ = iVar92;
                    auVar96._12_4_ = iVar92;
                    auVar73._4_4_ = -(uint)(auVar62._4_4_ == iVar15);
                    auVar73._12_4_ = -(uint)(auVar62._12_4_ == iVar80);
                    auVar73._0_4_ = auVar73._4_4_;
                    auVar73._8_4_ = auVar73._12_4_;
                    auVar84._4_4_ = iVar88;
                    auVar84._0_4_ = iVar88;
                    auVar84._8_4_ = iVar93;
                    auVar84._12_4_ = iVar93;
                    auVar84 = auVar84 | auVar73 & auVar96;
                    auVar72 = ~auVar84 & auVar53 | auVar37 & auVar84;
                    auVar37 = auVar72 ^ auVar50;
                    iVar15 = -(uint)(auVar37._0_4_ < auVar57._0_4_);
                    iVar80 = -(uint)(auVar37._4_4_ < iVar79);
                    iVar87 = -(uint)(auVar37._8_4_ < auVar57._8_4_);
                    iVar88 = -(uint)(auVar37._12_4_ < iVar81);
                    auVar91._4_4_ = iVar15;
                    auVar91._0_4_ = iVar15;
                    auVar91._8_4_ = iVar87;
                    auVar91._12_4_ = iVar87;
                    auVar62._4_4_ = -(uint)(auVar37._4_4_ == iVar79);
                    auVar62._12_4_ = -(uint)(auVar37._12_4_ == iVar81);
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar58._4_4_ = iVar80;
                    auVar58._0_4_ = iVar80;
                    auVar58._8_4_ = iVar88;
                    auVar58._12_4_ = iVar88;
                    auVar58 = auVar58 | auVar62 & auVar91;
                    auVar62 = ~auVar58 & auVar40 | auVar72 & auVar58;
                    auVar37 = auVar62 ^ auVar50;
                    iVar15 = -(uint)(auVar37._0_4_ < auVar64._0_4_);
                    iVar79 = -(uint)(auVar37._4_4_ < iVar69);
                    iVar80 = -(uint)(auVar37._8_4_ < auVar64._8_4_);
                    iVar81 = -(uint)(auVar37._12_4_ < iVar70);
                    auVar85._4_4_ = iVar15;
                    auVar85._0_4_ = iVar15;
                    auVar85._8_4_ = iVar80;
                    auVar85._12_4_ = iVar80;
                    iVar15 = -(uint)(auVar37._4_4_ == iVar69);
                    iVar80 = -(uint)(auVar37._12_4_ == iVar70);
                    auVar65._4_4_ = iVar15;
                    auVar65._0_4_ = iVar15;
                    auVar65._8_4_ = iVar80;
                    auVar65._12_4_ = iVar80;
                    auVar57._4_4_ = iVar79;
                    auVar57._0_4_ = iVar79;
                    auVar57._8_4_ = iVar81;
                    auVar57._12_4_ = iVar81;
                    auVar57 = auVar57 | auVar65 & auVar85;
                    auVar37 = ~auVar57 & auVar43 | auVar62 & auVar57;
                    piVar5 = ((ppVar8->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar22) = auVar53._0_4_;
                    *(int *)((long)piVar5 + lVar17 + lVar22) = auVar53._8_4_;
                    auVar54._0_8_ = auVar53._0_8_ - uVar11;
                    auVar54._8_8_ = auVar53._8_8_ - (ulong)(uint)open;
                    auVar83._0_8_ = auVar40._0_8_ - uVar29;
                    uVar20 = (ulong)(uint)gap;
                    auVar83._8_8_ = auVar40._8_8_ - uVar20;
                    auVar62 = auVar83 ^ auVar50;
                    auVar40 = auVar54 ^ auVar50;
                    iVar79 = -(uint)(auVar40._0_4_ < auVar62._0_4_);
                    iVar15 = auVar40._4_4_;
                    auVar74._4_4_ = -(uint)(iVar15 < auVar62._4_4_);
                    iVar81 = -(uint)(auVar40._8_4_ < auVar62._8_4_);
                    iVar80 = auVar40._12_4_;
                    auVar74._12_4_ = -(uint)(iVar80 < auVar62._12_4_);
                    auVar86._4_4_ = iVar79;
                    auVar86._0_4_ = iVar79;
                    auVar86._8_4_ = iVar81;
                    auVar86._12_4_ = iVar81;
                    auVar66._4_4_ = -(uint)(auVar62._4_4_ == iVar15);
                    auVar66._12_4_ = -(uint)(auVar62._12_4_ == iVar80);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar74 = auVar74 | auVar66 & auVar86;
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar18) =
                         ~auVar74 & auVar54 | auVar83 & auVar74;
                    auVar53._0_8_ = auVar43._0_8_ - uVar29;
                    auVar53._8_8_ = auVar43._8_8_ - uVar20;
                    auVar43 = auVar53 ^ auVar50;
                    iVar79 = -(uint)(auVar40._0_4_ < auVar43._0_4_);
                    iVar81 = -(uint)(iVar15 < auVar43._4_4_);
                    iVar69 = -(uint)(auVar40._8_4_ < auVar43._8_4_);
                    iVar70 = -(uint)(iVar80 < auVar43._12_4_);
                    auVar75._4_4_ = iVar79;
                    auVar75._0_4_ = iVar79;
                    auVar75._8_4_ = iVar69;
                    auVar75._12_4_ = iVar69;
                    auVar64._4_4_ = -(uint)(auVar43._4_4_ == iVar15);
                    auVar64._12_4_ = -(uint)(auVar43._12_4_ == iVar80);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar59._4_4_ = iVar81;
                    auVar59._0_4_ = iVar81;
                    auVar59._8_4_ = iVar70;
                    auVar59._12_4_ = iVar70;
                    auVar59 = auVar59 | auVar64 & auVar75;
                    auVar43 = ~auVar59 & auVar54 | auVar53 & auVar59;
                    plVar1 = (long *)((long)*ptr + lVar18);
                    iVar49 = *plVar1;
                    lVar28 = plVar1[1];
                    lVar18 = lVar18 + 0x10;
                    lVar22 = lVar22 + uVar21 * 4;
                  } while (lVar14 != lVar18);
                  bVar6 = true;
                  do {
                    bVar16 = bVar6;
                    auVar43._8_8_ = auVar43._0_8_;
                    auVar43._0_8_ = ptr_01[uVar12 + 1] - uVar11;
                    lVar18 = 0;
                    lVar22 = lVar13;
                    do {
                      auVar40 = *(undefined1 (*) [16])((long)*ptr_02 + lVar18);
                      auVar62 = auVar43 ^ auVar50;
                      auVar57 = auVar40 ^ auVar50;
                      iVar61 = -(uint)(auVar62._0_4_ < auVar57._0_4_);
                      iVar15 = -(uint)(auVar62._4_4_ < auVar57._4_4_);
                      iVar80 = -(uint)(auVar62._8_4_ < auVar57._8_4_);
                      iVar79 = -(uint)(auVar62._12_4_ < auVar57._12_4_);
                      auVar76._4_4_ = iVar61;
                      auVar76._0_4_ = iVar61;
                      auVar76._8_4_ = iVar80;
                      auVar76._12_4_ = iVar80;
                      auVar60._4_4_ = -(uint)(auVar57._4_4_ == auVar62._4_4_);
                      auVar60._12_4_ = -(uint)(auVar57._12_4_ == auVar62._12_4_);
                      auVar60._0_4_ = auVar60._4_4_;
                      auVar60._8_4_ = auVar60._12_4_;
                      auVar46._4_4_ = iVar15;
                      auVar46._0_4_ = iVar15;
                      auVar46._8_4_ = iVar79;
                      auVar46._12_4_ = iVar79;
                      auVar46 = auVar46 | auVar60 & auVar76;
                      auVar62 = ~auVar46 & auVar43 | auVar40 & auVar46;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar18) = auVar62;
                      auVar40 = auVar37 ^ auVar50;
                      auVar57 = auVar62 ^ auVar50;
                      iVar61 = -(uint)(auVar40._0_4_ < auVar57._0_4_);
                      iVar15 = auVar57._4_4_;
                      auVar67._4_4_ = -(uint)(auVar40._4_4_ < iVar15);
                      iVar81 = auVar57._12_4_;
                      iVar80 = -(uint)(auVar40._8_4_ < auVar57._8_4_);
                      auVar67._12_4_ = -(uint)(auVar40._12_4_ < iVar81);
                      auVar77._4_4_ = iVar61;
                      auVar77._0_4_ = iVar61;
                      auVar77._8_4_ = iVar80;
                      auVar77._12_4_ = iVar80;
                      auVar38._4_4_ = -(uint)(auVar40._4_4_ == iVar15);
                      auVar38._12_4_ = -(uint)(auVar40._12_4_ == iVar81);
                      auVar38._0_4_ = auVar38._4_4_;
                      auVar38._8_4_ = auVar38._12_4_;
                      auVar67._0_4_ = auVar67._4_4_;
                      auVar67._8_4_ = auVar67._12_4_;
                      auVar67 = auVar67 | auVar38 & auVar77;
                      auVar37 = ~auVar67 & auVar62 | auVar37 & auVar67;
                      auVar40 = auVar41 ^ auVar50;
                      iVar61 = -(uint)(auVar57._0_4_ < auVar40._0_4_);
                      iVar80 = -(uint)(iVar15 < auVar40._4_4_);
                      iVar79 = -(uint)(auVar57._8_4_ < auVar40._8_4_);
                      iVar69 = -(uint)(iVar81 < auVar40._12_4_);
                      auVar78._4_4_ = iVar61;
                      auVar78._0_4_ = iVar61;
                      auVar78._8_4_ = iVar79;
                      auVar78._12_4_ = iVar79;
                      auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar15);
                      auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar81);
                      auVar42._0_4_ = auVar42._4_4_;
                      auVar42._8_4_ = auVar42._12_4_;
                      auVar55._4_4_ = iVar80;
                      auVar55._0_4_ = iVar80;
                      auVar55._8_4_ = iVar69;
                      auVar55._12_4_ = iVar69;
                      auVar55 = auVar55 | auVar42 & auVar78;
                      auVar41 = ~auVar55 & auVar62 | auVar41 & auVar55;
                      piVar5 = ((ppVar8->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar22) = auVar62._0_4_;
                      lVar23 = (long)piVar5 + lVar22;
                      *(int *)(lVar17 + lVar23) = auVar62._8_4_;
                      auVar47._0_8_ = auVar62._0_8_ - uVar11;
                      auVar47._8_8_ = auVar62._8_8_ - (ulong)(uint)open;
                      lVar45 = auVar43._8_8_;
                      auVar43._0_8_ = auVar43._0_8_ - uVar29;
                      auVar43._8_8_ = lVar45 - uVar20;
                      auVar47 = auVar47 ^ auVar50;
                      auVar40 = auVar43 ^ auVar50;
                      iVar61 = -(uint)(auVar47._0_4_ < auVar40._0_4_);
                      iVar80 = -(uint)(auVar47._4_4_ < auVar40._4_4_);
                      iVar15 = -(uint)(auVar47._8_4_ < auVar40._8_4_);
                      iVar79 = -(uint)(auVar47._12_4_ < auVar40._12_4_);
                      auVar68._4_4_ = iVar61;
                      auVar68._0_4_ = iVar61;
                      auVar68._8_4_ = iVar15;
                      auVar68._12_4_ = iVar15;
                      iVar61 = -(uint)(auVar40._4_4_ == auVar47._4_4_);
                      iVar15 = -(uint)(auVar40._12_4_ == auVar47._12_4_);
                      auVar48._4_4_ = iVar61;
                      auVar48._0_4_ = iVar61;
                      auVar48._8_4_ = iVar15;
                      auVar48._12_4_ = iVar15;
                      auVar56._4_4_ = iVar80;
                      auVar56._0_4_ = iVar80;
                      auVar56._8_4_ = iVar79;
                      auVar56._12_4_ = iVar79;
                      iVar61 = movmskps((int)lVar23,auVar56 | auVar48 & auVar68);
                      if (iVar61 == 0) goto LAB_005c02b1;
                      lVar18 = lVar18 + 0x10;
                      lVar22 = lVar22 + uVar21 * 4;
                    } while (lVar14 != lVar18);
                    bVar6 = false;
                  } while (bVar16);
LAB_005c02b1:
                  uVar12 = uVar12 + 1;
                  lVar13 = lVar13 + 4;
                  palVar9 = ptr_02;
                  if (uVar12 == uVar21) {
                    lVar28 = ptr_02[(ulong)uVar7 % size][0];
                    iVar61 = (int)ptr_02[(ulong)uVar7 % size][1];
                    if (iVar36 < 1) {
                      do {
                        iVar61 = (int)lVar28;
                        lVar28 = 0;
                      } while (iVar36 < 0);
                    }
                    auVar30._8_4_ = (int)uVar24;
                    auVar30._0_8_ = uVar24;
                    auVar30._12_4_ = (int)(uVar24 >> 0x20);
                    auVar37 = auVar37 ^ auVar50;
                    auVar30 = auVar30 ^ auVar50;
                    iVar15 = -(uint)(auVar30._0_4_ < auVar37._0_4_);
                    auVar34._4_4_ = -(uint)(auVar30._4_4_ < auVar37._4_4_);
                    iVar36 = -(uint)(auVar30._8_4_ < auVar37._8_4_);
                    auVar34._12_4_ = -(uint)(auVar30._12_4_ < auVar37._12_4_);
                    auVar44._4_4_ = iVar15;
                    auVar44._0_4_ = iVar15;
                    auVar44._8_4_ = iVar36;
                    auVar44._12_4_ = iVar36;
                    auVar31._4_4_ = -(uint)(auVar30._4_4_ == auVar37._4_4_);
                    auVar31._12_4_ = -(uint)(auVar30._12_4_ == auVar37._12_4_);
                    auVar31._0_4_ = auVar31._4_4_;
                    auVar31._8_4_ = auVar31._12_4_;
                    auVar34._0_4_ = auVar34._4_4_;
                    auVar34._8_4_ = auVar34._12_4_;
                    auVar32._8_4_ = 0xffffffff;
                    auVar32._0_8_ = 0xffffffffffffffff;
                    auVar32._12_4_ = 0xffffffff;
                    auVar25._8_4_ = (int)lVar19;
                    auVar25._0_8_ = lVar19;
                    auVar25._12_4_ = uVar27;
                    auVar41 = auVar41 ^ auVar50;
                    auVar25 = auVar25 ^ auVar50;
                    iVar15 = -(uint)(auVar25._0_4_ < auVar41._0_4_);
                    auVar35._4_4_ = -(uint)(auVar25._4_4_ < auVar41._4_4_);
                    iVar36 = -(uint)(auVar25._8_4_ < auVar41._8_4_);
                    auVar35._12_4_ = -(uint)(auVar25._12_4_ < auVar41._12_4_);
                    auVar39._4_4_ = iVar15;
                    auVar39._0_4_ = iVar15;
                    auVar39._8_4_ = iVar36;
                    auVar39._12_4_ = iVar36;
                    auVar26._4_4_ = -(uint)(auVar25._4_4_ == auVar41._4_4_);
                    auVar26._12_4_ = -(uint)(auVar25._12_4_ == auVar41._12_4_);
                    auVar26._0_4_ = auVar26._4_4_;
                    auVar26._8_4_ = auVar26._12_4_;
                    auVar35._0_4_ = auVar35._4_4_;
                    auVar35._8_4_ = auVar35._12_4_;
                    auVar41 = auVar35 | auVar26 & auVar39 | auVar32 ^ (auVar34 | auVar31 & auVar44);
                    if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar41 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar41 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar41 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar41 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar41 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar41[0xf] < '\0') {
                      *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                      iVar61 = 0;
                      iVar10 = 0;
                      uVar7 = 0;
                    }
                    ppVar8->score = iVar61;
                    ppVar8->end_query = uVar7;
                    ppVar8->end_ref = iVar10;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar8;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}